

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attrs.c
# Opt level: O2

Node * GetNodeByAnchor(TidyDocImpl *doc,ctmbstr name)

{
  int iVar1;
  uint uVar2;
  tmbstr s;
  Anchor *pAVar3;
  
  s = prvTidytmbstrdup(doc->allocator,name);
  iVar1 = prvTidyHTMLVersion(doc);
  if (iVar1 == 0x20000) {
    uVar2 = anchorNameHash5(name);
  }
  else {
    uVar2 = anchorNameHash(name);
    s = prvTidytmbstrtolower(s);
  }
  pAVar3 = (Anchor *)((doc->attribs).anchor_hash + uVar2);
  do {
    pAVar3 = pAVar3->next;
    if (pAVar3 == (Anchor *)0x0) {
      (*doc->allocator->vtbl->free)(doc->allocator,s);
      return (Node *)0x0;
    }
    iVar1 = prvTidytmbstrcmp(pAVar3->name,s);
  } while (iVar1 != 0);
  (*doc->allocator->vtbl->free)(doc->allocator,s);
  return pAVar3->node;
}

Assistant:

static Node* GetNodeByAnchor( TidyDocImpl* doc, ctmbstr name )
{
    TidyAttribImpl* attribs = &doc->attribs;
    Anchor *found;
    uint h;
    tmbstr lname = TY_(tmbstrdup)(doc->allocator, name);
    if (TY_(HTMLVersion)(doc) == HT50) {
        h = anchorNameHash5(name);
    }
    else
    {
        h = anchorNameHash(name);
        lname = TY_(tmbstrtolower)(lname);
    }

    for ( found = attribs->anchor_hash[h]; found != NULL; found = found->next )
    {
        if ( TY_(tmbstrcmp)(found->name, lname) == 0 )
            break;
    }
    
    TidyDocFree(doc, lname);
    if ( found )
        return found->node;
    return NULL;
}